

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::DecodeRemaining
          (string *__return_storage_ptr__,NumericCharacterEntity *this,string *s,size_t start)

{
  char *pcVar1;
  string *this_00;
  stringstream ss;
  string asStack_1f8 [32];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  if (s->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_1b8);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__cxx11::string::substr((ulong)asStack_1f8,(ulong)s);
    std::operator<<(local_1a8,asStack_1f8);
    std::__cxx11::string::~string(asStack_1f8);
    while (start = start + 1, start < s->_M_string_length) {
      pcVar1 = (char *)std::__cxx11::string::at((ulong)s);
      if ((*pcVar1 == '&') && (start < s->_M_string_length - 3)) {
        this_00 = &local_1d8;
        std::__cxx11::string::string((string *)&local_1d8,(string *)s);
        start = NextDecodedChar((NumericCharacterEntity *)this_00,(stringstream *)local_1b8,
                                &local_1d8,start);
        std::__cxx11::string::~string((string *)&local_1d8);
      }
      else {
        std::operator<<(local_1a8,*pcVar1);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectFormatter::NumericCharacterEntity::DecodeRemaining(std::string s, size_t start)
{
    if (s.empty())
    {
        return "";
    }

    std::stringstream ss;
    ss << s.substr(0, start);

    for (size_t i = start + 1; i < s.length(); i++)
    {
        char c = s.at(i);

        if (c == '&' && i < s.length() - 3)
        {
            i = NextDecodedChar(ss, s, i);
        }
        else
        {
            ss << c;
        }
    }

    return ss.str();
}